

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O3

void outputHandleGeometry
               (void *userData,wl_output *output,int32_t x,int32_t y,int32_t physicalWidth,
               int32_t physicalHeight,int32_t subpixel,char *make,char *model,int32_t transform)

{
  *(int32_t *)((long)userData + 0x110) = x;
  *(int32_t *)((long)userData + 0x114) = y;
  *(int32_t *)((long)userData + 0x88) = physicalWidth;
  *(int32_t *)((long)userData + 0x8c) = physicalHeight;
  if (*userData != '\0') {
    return;
  }
  snprintf((char *)userData,0x80,"%s %s",make,model);
  return;
}

Assistant:

static void outputHandleGeometry(void* userData,
                                 struct wl_output* output,
                                 int32_t x,
                                 int32_t y,
                                 int32_t physicalWidth,
                                 int32_t physicalHeight,
                                 int32_t subpixel,
                                 const char* make,
                                 const char* model,
                                 int32_t transform)
{
    struct _GLFWmonitor* monitor = userData;

    monitor->wl.x = x;
    monitor->wl.y = y;
    monitor->widthMM = physicalWidth;
    monitor->heightMM = physicalHeight;

    if (strlen(monitor->name) == 0)
        snprintf(monitor->name, sizeof(monitor->name), "%s %s", make, model);
}